

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGLDriver::getColorBuffer
          (COpenGLDriver *this,void *vertices,u32 vertexCount,E_VERTEX_TYPE vType)

{
  ulong __new_size;
  ulong uVar1;
  SColor *pSVar2;
  array<unsigned_char> *this_00;
  
  __new_size = (ulong)(vertexCount << 2);
  this_00 = &this->ColorBuffer;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this_00->m_data,__new_size);
  if (vType == EVT_STANDARD) {
    pSVar2 = (SColor *)((long)vertices + 0x18);
    for (uVar1 = 0; uVar1 < __new_size; uVar1 = uVar1 + 4) {
      SColor::toOpenGLColor
                (pSVar2,(this_00->m_data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar1);
      pSVar2 = pSVar2 + 9;
    }
  }
  else if (vType == EVT_2TCOORDS) {
    pSVar2 = (SColor *)((long)vertices + 0x18);
    for (uVar1 = 0; uVar1 < __new_size; uVar1 = uVar1 + 4) {
      SColor::toOpenGLColor
                (pSVar2,(this_00->m_data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar1);
      pSVar2 = pSVar2 + 0xb;
    }
  }
  else if (vType == EVT_TANGENTS) {
    pSVar2 = (SColor *)((long)vertices + 0x18);
    for (uVar1 = 0; uVar1 < __new_size; uVar1 = uVar1 + 4) {
      SColor::toOpenGLColor
                (pSVar2,(this_00->m_data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar1);
      pSVar2 = pSVar2 + 0xf;
    }
  }
  return;
}

Assistant:

void COpenGLDriver::getColorBuffer(const void *vertices, u32 vertexCount, E_VERTEX_TYPE vType)
{
	// convert colors to gl color format.
	vertexCount *= 4; // reused as color component count
	ColorBuffer.set_used(vertexCount);
	u32 i;

	switch (vType) {
	case EVT_STANDARD: {
		const S3DVertex *p = static_cast<const S3DVertex *>(vertices);
		for (i = 0; i < vertexCount; i += 4) {
			p->Color.toOpenGLColor(&ColorBuffer[i]);
			++p;
		}
	} break;
	case EVT_2TCOORDS: {
		const S3DVertex2TCoords *p = static_cast<const S3DVertex2TCoords *>(vertices);
		for (i = 0; i < vertexCount; i += 4) {
			p->Color.toOpenGLColor(&ColorBuffer[i]);
			++p;
		}
	} break;
	case EVT_TANGENTS: {
		const S3DVertexTangents *p = static_cast<const S3DVertexTangents *>(vertices);
		for (i = 0; i < vertexCount; i += 4) {
			p->Color.toOpenGLColor(&ColorBuffer[i]);
			++p;
		}
	} break;
	}
}